

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

void __thiscall cmFileAPI::ReadQueries(cmFileAPI *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  string *query;
  pointer client;
  string query_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  queries;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (this->APIv1)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->APIv1)._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  bVar2 = cmsys::SystemTools::FileIsDirectory(&local_68);
  this->QueryExists = bVar2;
  if (bVar2) {
    LoadDir(&local_48,&local_68);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      client = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar3 = strncmp((client->_M_dataplus)._M_p,"client-",7);
        if (iVar3 == 0) {
          ReadClient(this,client);
        }
        else {
          bVar2 = ReadQuery(client,&(this->TopQuery).Known);
          if (!bVar2) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(this->TopQuery).Unknown,client);
          }
        }
        client = client + 1;
      } while (client != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFileAPI::ReadQueries()
{
  std::string const query_dir = this->APIv1 + "/query";
  this->QueryExists = cmSystemTools::FileIsDirectory(query_dir);
  if (!this->QueryExists) {
    return;
  }

  // Load queries at the top level.
  std::vector<std::string> queries = cmFileAPI::LoadDir(query_dir);

  // Read the queries and save for later.
  for (std::string& query : queries) {
    if (cmHasLiteralPrefix(query, "client-")) {
      this->ReadClient(query);
    } else if (!cmFileAPI::ReadQuery(query, this->TopQuery.Known)) {
      this->TopQuery.Unknown.push_back(std::move(query));
    }
  }
}